

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

string * Json::StyledStreamWriter::normalizeEOL(string *text)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  string *in_RDI;
  char c;
  char *current;
  char *end;
  char *begin;
  string *normalized;
  char *local_40;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)in_RDI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::length();
  local_40 = pcVar1;
  while (local_40 != pcVar1 + lVar2) {
    pcVar3 = local_40 + 1;
    if (*local_40 == '\r') {
      if (*pcVar3 == '\n') {
        pcVar3 = local_40 + 2;
      }
      local_40 = pcVar3;
      std::__cxx11::string::operator+=((string *)in_RDI,'\n');
    }
    else {
      std::__cxx11::string::operator+=((string *)in_RDI,*local_40);
      local_40 = pcVar3;
    }
  }
  return in_RDI;
}

Assistant:

std::string StyledStreamWriter::normalizeEOL(const std::string& text) {
  std::string normalized;
  normalized.reserve(text.length());
  const char* begin = text.c_str();
  const char* end = begin + text.length();
  const char* current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') // mac or dos EOL
    {
      if (*current == '\n') // convert dos EOL
        ++current;
      normalized += '\n';
    } else // handle unix EOL & other char
      normalized += c;
  }
  return normalized;
}